

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

Vec_Int_t * Glucose_SolverFromAig(Gia_Man_t *p,SimpSolver *s)

{
  Cnf_Dat_t *this;
  Vec_Int_t *pVVar1;
  abctime aVar2;
  Vec_Int_t *vCnfIds;
  int *local_40;
  int *pLit;
  Cnf_Dat_t *pCStack_30;
  int i;
  Cnf_Dat_t *pCnf;
  vec<Gluco::Lit> *lits;
  abctime clk;
  SimpSolver *s_local;
  Gia_Man_t *p_local;
  
  clk = (abctime)s;
  s_local = (SimpSolver *)p;
  lits = (vec<Gluco::Lit> *)Abc_Clock();
  pCnf = (Cnf_Dat_t *)(clk + 0x48);
  pCStack_30 = (Cnf_Dat_t *)Mf_ManGenerateCnf((Gia_Man_t *)s_local,8,0,1,0,0);
  for (pLit._4_4_ = 0; pLit._4_4_ < pCStack_30->nClauses; pLit._4_4_ = pLit._4_4_ + 1) {
    Gluco::vec<Gluco::Lit>::clear((vec<Gluco::Lit> *)pCnf,false);
    for (local_40 = pCStack_30->pClauses[pLit._4_4_]; this = pCnf,
        local_40 < pCStack_30->pClauses[pLit._4_4_ + 1]; local_40 = local_40 + 1) {
      vCnfIds._4_4_ = Gluco::toLit(*local_40);
      Gluco::vec<Gluco::Lit>::push((vec<Gluco::Lit> *)this,(Lit *)((long)&vCnfIds + 4));
      Gluco::SimpSolver::addVar((SimpSolver *)clk,*local_40 >> 1);
    }
    Gluco::SimpSolver::addClause((SimpSolver *)clk,(vec<Gluco::Lit> *)pCnf);
  }
  pVVar1 = Vec_IntAllocArrayCopy(pCStack_30->pVarNums,pCStack_30->nVars);
  printf("CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ",(ulong)(uint)pCStack_30->nVars,
         (ulong)(uint)pCStack_30->nClauses,(ulong)(uint)pCStack_30->nLiterals);
  aVar2 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar2 - (long)lits);
  Cnf_DataFree(pCStack_30);
  return pVVar1;
}

Assistant:

Vec_Int_t * Glucose_SolverFromAig( Gia_Man_t * p, SimpSolver& s )
{
    abctime clk = Abc_Clock();
    vec<Lit> * lits = &s.user_lits;
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8 /*nLutSize*/, 0 /*fCnfObjIds*/, 1/*fAddOrCla*/, 0, 0/*verbose*/ );
    for ( int i = 0; i < pCnf->nClauses; i++ )
    {
        lits->clear();
        for ( int * pLit = pCnf->pClauses[i]; pLit < pCnf->pClauses[i+1]; pLit++ )
            lits->push( toLit(*pLit) ), s.addVar( *pLit >> 1 );
        s.addClause(*lits);
    }
    Vec_Int_t * vCnfIds = Vec_IntAllocArrayCopy(pCnf->pVarNums,pCnf->nVars);
    printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Cnf_DataFree(pCnf);
    return vCnfIds;
}